

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::AddFeatureFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang)

{
  bool bVar1;
  string local_50;
  
  cmLocalGenerator::AddLanguageFlags
            (&this->LocalGenerator->super_cmLocalGenerator,flags,lang,&this->ConfigName);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"INTERPROCEDURAL_OPTIMIZATION","");
  bVar1 = cmGeneratorTarget::GetFeatureAsBool(this->GeneratorTarget,&local_50,&this->ConfigName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    cmLocalGenerator::AppendFeatureOptions
              (&this->LocalGenerator->super_cmLocalGenerator,flags,lang,"IPO");
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddFeatureFlags(
  std::string& flags, const std::string& lang
  )
{
  // Add language-specific flags.
  this->LocalGenerator->AddLanguageFlags(flags, lang, this->ConfigName);

  if(this->GetFeatureAsBool("INTERPROCEDURAL_OPTIMIZATION"))
    {
    this->LocalGenerator->AppendFeatureOptions(flags, lang, "IPO");
    }
}